

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::ImmutableMessageGenerator::GenerateDescriptorMethods
          (ImmutableMessageGenerator *this,Printer *printer)

{
  Nonnull<char_*> buffer;
  FieldDescriptor *field_00;
  JavaType JVar1;
  Descriptor *pDVar2;
  FieldGeneratorInfo *pFVar3;
  Nonnull<char_*> pcVar4;
  Descriptor *descriptor;
  Descriptor *descriptor_00;
  FieldDescriptor **ppFVar5;
  long lVar6;
  long lVar7;
  string_view text;
  string_view text_00;
  string_view text_01;
  string_view text_02;
  string_view text_03;
  string_view text_04;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  map_fields;
  FieldDescriptor *field;
  FieldDescriptor **local_d8;
  iterator iStack_d0;
  FieldDescriptor **local_c8;
  string local_b8;
  undefined1 local_98 [48];
  ImmutableMessageGenerator *local_68;
  Printer *local_60;
  FieldDescriptor **local_58;
  string local_50;
  
  pDVar2 = (this->super_MessageGenerator).descriptor_;
  if ((pDVar2->options_->field_0)._impl_.no_standard_descriptor_accessor_ == false) {
    ClassNameResolver::GetClassName_abi_cxx11_
              ((string *)local_98,this->name_resolver_,pDVar2->file_,true);
    UniqueFileScopeIdentifier_abi_cxx11_
              (&local_b8,(java *)(this->super_MessageGenerator).descriptor_,descriptor);
    text._M_str = 
    "public static final com.google.protobuf.Descriptors.Descriptor\n    getDescriptor() {\n  return $fileclass$.internal_$identifier$_descriptor;\n}\n\n"
    ;
    text._M_len = 0x8f;
    io::Printer::Print<char[10],std::__cxx11::string,char[11],std::__cxx11::string>
              (printer,text,(char (*) [10])"fileclass",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
               (char (*) [11])0x578ccb,&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    if ((FieldDescriptor *)local_98._0_8_ != (FieldDescriptor *)(local_98 + 0x10)) {
      operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
    }
  }
  local_d8 = (FieldDescriptor **)0x0;
  iStack_d0._M_current = (FieldDescriptor **)0x0;
  local_c8 = (FieldDescriptor **)0x0;
  pDVar2 = (this->super_MessageGenerator).descriptor_;
  if (0 < pDVar2->field_count_) {
    lVar7 = 0;
    lVar6 = 0;
    do {
      local_98._0_8_ = &pDVar2->fields_->super_SymbolBase + lVar7;
      JVar1 = GetJavaType((FieldDescriptor *)local_98._0_8_);
      if (JVar1 == JAVATYPE_MESSAGE) {
        pDVar2 = FieldDescriptor::message_type((FieldDescriptor *)local_98._0_8_);
        if ((pDVar2->options_->field_0)._impl_.map_entry_ == true) {
          if (iStack_d0._M_current == local_c8) {
            std::
            vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
            ::_M_realloc_insert<google::protobuf::FieldDescriptor_const*const&>
                      ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                        *)&local_d8,iStack_d0,(FieldDescriptor **)local_98);
          }
          else {
            *iStack_d0._M_current = (FieldDescriptor *)local_98._0_8_;
            iStack_d0._M_current = iStack_d0._M_current + 1;
          }
        }
      }
      lVar6 = lVar6 + 1;
      pDVar2 = (this->super_MessageGenerator).descriptor_;
      lVar7 = lVar7 + 0x58;
    } while (lVar6 < pDVar2->field_count_);
  }
  if (local_d8 != iStack_d0._M_current) {
    text_00._M_str =
         "@SuppressWarnings({\"rawtypes\"})\n@java.lang.Override\nprotected com.google.protobuf.MapFieldReflectionAccessor internalGetMapFieldReflection(\n    int number) {\n  switch (number) {\n"
    ;
    text_00._M_len = 0xb2;
    io::Printer::Print<>(printer,text_00);
    printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent * 2;
    local_58 = iStack_d0._M_current;
    local_68 = this;
    if (local_d8 != iStack_d0._M_current) {
      buffer = local_98 + 0x10;
      ppFVar5 = local_d8;
      local_60 = printer;
      do {
        field_00 = *ppFVar5;
        pFVar3 = Context::GetFieldGeneratorInfo(local_68->context_,field_00);
        pcVar4 = absl::lts_20250127::numbers_internal::FastIntToBuffer(field_00->number_,buffer);
        local_98._0_8_ = pcVar4 + -(long)buffer;
        local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
        local_98._8_8_ = buffer;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,buffer,pcVar4);
        printer = local_60;
        text_01._M_str = "case $number$:\n  return internalGet$capitalized_name$();\n";
        text_01._M_len = 0x39;
        io::Printer::Print<char[7],std::__cxx11::string,char[17],std::__cxx11::string>
                  (local_60,text_01,(char (*) [7])0x6e9ba7,&local_b8,(char (*) [17])0x5e544e,
                   &pFVar3->capitalized_name);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
        ppFVar5 = ppFVar5 + 1;
      } while (ppFVar5 != local_58);
    }
    text_02._M_str =
         "default:\n  throw new RuntimeException(\n      \"Invalid map field number: \" + number);\n"
    ;
    text_02._M_len = 0x55;
    io::Printer::Print<>(printer,text_02);
    this = local_68;
    io::Printer::Outdent(printer);
    io::Printer::Outdent(printer);
    text_03._M_str = "  }\n}\n";
    text_03._M_len = 6;
    io::Printer::Print<>(printer,text_03);
  }
  ClassNameResolver::GetClassName_abi_cxx11_
            ((string *)local_98,this->name_resolver_,(this->super_MessageGenerator).descriptor_,true
            );
  ClassNameResolver::GetClassName_abi_cxx11_
            (&local_b8,this->name_resolver_,((this->super_MessageGenerator).descriptor_)->file_,true
            );
  UniqueFileScopeIdentifier_abi_cxx11_
            (&local_50,(java *)(this->super_MessageGenerator).descriptor_,descriptor_00);
  text_04._M_str =
       "@java.lang.Override\nprotected com.google.protobuf.GeneratedMessage.FieldAccessorTable\n    internalGetFieldAccessorTable() {\n  return $fileclass$.internal_$identifier$_fieldAccessorTable\n      .ensureFieldAccessorsInitialized(\n          $classname$.class, $classname$.Builder.class);\n}\n\n"
  ;
  text_04._M_len = 0x11e;
  io::Printer::
  Print<char[10],std::__cxx11::string,char[10],std::__cxx11::string,char[11],std::__cxx11::string>
            (printer,text_04,(char (*) [10])0x5620ff,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
             (char (*) [10])"fileclass",&local_b8,(char (*) [11])0x578ccb,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if ((FieldDescriptor *)local_98._0_8_ != (FieldDescriptor *)(local_98 + 0x10)) {
    operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
  }
  if (local_d8 != (FieldDescriptor **)0x0) {
    operator_delete(local_d8,(long)local_c8 - (long)local_d8);
  }
  return;
}

Assistant:

void ImmutableMessageGenerator::GenerateDescriptorMethods(
    io::Printer* printer) {
  if (!descriptor_->options().no_standard_descriptor_accessor()) {
    printer->Print(
        "public static final com.google.protobuf.Descriptors.Descriptor\n"
        "    getDescriptor() {\n"
        "  return $fileclass$.internal_$identifier$_descriptor;\n"
        "}\n"
        "\n",
        "fileclass", name_resolver_->GetImmutableClassName(descriptor_->file()),
        "identifier", UniqueFileScopeIdentifier(descriptor_));
  }
  std::vector<const FieldDescriptor*> map_fields;
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    if (GetJavaType(field) == JAVATYPE_MESSAGE &&
        IsMapEntry(field->message_type())) {
      map_fields.push_back(field);
    }
  }
  if (!map_fields.empty()) {
    printer->Print(
        "@SuppressWarnings({\"rawtypes\"})\n"
        "@java.lang.Override\n"
        "protected com.google.protobuf.MapFieldReflectionAccessor "
        "internalGetMapFieldReflection(\n"
        "    int number) {\n"
        "  switch (number) {\n");
    printer->Indent();
    printer->Indent();
    for (const FieldDescriptor* field : map_fields) {
      const FieldGeneratorInfo* info = context_->GetFieldGeneratorInfo(field);
      printer->Print(
          "case $number$:\n"
          "  return internalGet$capitalized_name$();\n",
          "number", absl::StrCat(field->number()), "capitalized_name",
          info->capitalized_name);
    }
    printer->Print(
        "default:\n"
        "  throw new RuntimeException(\n"
        "      \"Invalid map field number: \" + number);\n");
    printer->Outdent();
    printer->Outdent();
    printer->Print(
        "  }\n"
        "}\n");
  }
  printer->Print(
      "@java.lang.Override\n"
      "protected com.google.protobuf.GeneratedMessage.FieldAccessorTable\n"
      "    internalGetFieldAccessorTable() {\n"
      "  return $fileclass$.internal_$identifier$_fieldAccessorTable\n"
      "      .ensureFieldAccessorsInitialized(\n"
      "          $classname$.class, $classname$.Builder.class);\n"
      "}\n"
      "\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_),
      "fileclass", name_resolver_->GetImmutableClassName(descriptor_->file()),
      "identifier", UniqueFileScopeIdentifier(descriptor_));
}